

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O2

Block * __thiscall soul::ModuleCloner::getRemappedBlock(ModuleCloner *this,Block *old)

{
  mapped_type *this_00;
  Block *pBVar1;
  key_type local_8;
  
  local_8.object = old;
  this_00 = std::__detail::
            _Map_base<soul::pool_ref<const_soul::heart::Block>,_std::pair<const_soul::pool_ref<const_soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::Block>_>,_std::hash<soul::pool_ref<const_soul::heart::Block>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<soul::pool_ref<const_soul::heart::Block>,_std::pair<const_soul::pool_ref<const_soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::Block>_>,_std::hash<soul::pool_ref<const_soul::heart::Block>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->blockMappings,&local_8);
  pBVar1 = pool_ptr<soul::heart::Block>::operator*(this_00);
  return pBVar1;
}

Assistant:

heart::Block& getRemappedBlock (heart::Block& old)                          { return *blockMappings[old]; }